

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerGenerator.cc
# Opt level: O0

void __thiscall InstructionInfo::generateOperandStruct(InstructionInfo *this,ostream *out)

{
  bool bVar1;
  ostream *poVar2;
  iterator iVar3;
  iterator iVar4;
  reference pFVar5;
  ulong uVar6;
  Field *f;
  iterator __end1;
  iterator __begin1;
  vector<Field,_std::allocator<Field>_> *__range1;
  undefined1 local_30 [8];
  vector<Field,_std::allocator<Field>_> sortedFields;
  ostream *out_local;
  InstructionInfo *this_local;
  
  sortedFields.super__Vector_base<Field,_std::allocator<Field>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)out;
  poVar2 = std::operator<<(out,"struct Opcode_");
  poVar2 = std::operator<<(poVar2,(string *)this);
  std::operator<<(poVar2,"\n");
  std::operator<<((ostream *)
                  sortedFields.super__Vector_base<Field,_std::allocator<Field>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,"{\n");
  std::operator<<((ostream *)
                  sortedFields.super__Vector_base<Field,_std::allocator<Field>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,"    TranslatedOpcode opcode;\n");
  std::vector<Field,_std::allocator<Field>_>::vector
            ((vector<Field,_std::allocator<Field>_> *)local_30,&this->fields);
  iVar3 = std::vector<Field,_std::allocator<Field>_>::begin
                    ((vector<Field,_std::allocator<Field>_> *)local_30);
  iVar4 = std::vector<Field,_std::allocator<Field>_>::end
                    ((vector<Field,_std::allocator<Field>_> *)local_30);
  std::
  sort<__gnu_cxx::__normal_iterator<Field*,std::vector<Field,std::allocator<Field>>>,InstructionInfo::generateOperandStruct(std::ostream&)::__0>
            (iVar3._M_current,iVar4._M_current);
  if ((this->branch & 1U) != 0) {
    std::operator<<((ostream *)
                    sortedFields.super__Vector_base<Field,_std::allocator<Field>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,"    uint32_t CIA;\n");
  }
  __end1 = std::vector<Field,_std::allocator<Field>_>::begin
                     ((vector<Field,_std::allocator<Field>_> *)local_30);
  f = (Field *)std::vector<Field,_std::allocator<Field>_>::end
                         ((vector<Field,_std::allocator<Field>_> *)local_30);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Field_*,_std::vector<Field,_std::allocator<Field>_>_>
                                     *)&f), bVar1) {
    pFVar5 = __gnu_cxx::__normal_iterator<Field_*,_std::vector<Field,_std::allocator<Field>_>_>::
             operator*(&__end1);
    uVar6 = std::__cxx11::string::empty();
    if (((uVar6 & 1) == 0) && ((pFVar5->match & 1U) == 0)) {
      std::operator<<((ostream *)
                      sortedFields.super__Vector_base<Field,_std::allocator<Field>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,"    ");
      if (pFVar5->to - pFVar5->from < 0x11) {
        if (pFVar5->to - pFVar5->from < 9) {
          std::operator<<((ostream *)
                          sortedFields.super__Vector_base<Field,_std::allocator<Field>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,"uint8_t");
        }
        else {
          std::operator<<((ostream *)
                          sortedFields.super__Vector_base<Field,_std::allocator<Field>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,"uint16_t");
        }
      }
      else {
        std::operator<<((ostream *)
                        sortedFields.super__Vector_base<Field,_std::allocator<Field>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,"uint32_t");
      }
      poVar2 = std::operator<<((ostream *)
                               sortedFields.super__Vector_base<Field,_std::allocator<Field>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage," ");
      poVar2 = std::operator<<(poVar2,(string *)&pFVar5->name);
      std::operator<<(poVar2,";\n");
    }
    __gnu_cxx::__normal_iterator<Field_*,_std::vector<Field,_std::allocator<Field>_>_>::operator++
              (&__end1);
  }
  std::operator<<((ostream *)
                  sortedFields.super__Vector_base<Field,_std::allocator<Field>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,"};\n\n");
  std::vector<Field,_std::allocator<Field>_>::~vector
            ((vector<Field,_std::allocator<Field>_> *)local_30);
  return;
}

Assistant:

void InstructionInfo::generateOperandStruct(std::ostream& out)
{
    out << "struct Opcode_" << name << "\n";
    out << "{\n";
    out << "    TranslatedOpcode opcode;\n";

    auto sortedFields = fields;
    std::sort(sortedFields.begin(), sortedFields.end(), [](const Field& a, const Field& b) {
        return (a.to - a.from) > (b.to - b.from);
    });
    if(branch)
        out << "    uint32_t CIA;\n";

    for(const Field& f : sortedFields)
    {
        if(f.name.empty() || f.match)
            continue;
        out << "    ";
        if(f.to-f.from > 16)
            out << "uint32_t";
        else if(f.to-f.from > 8)
            out << "uint16_t";
        else
            out << "uint8_t";
        out << " " << f.name << ";\n";
    }
        
    out << "};\n\n";
}